

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O0

void __thiscall
JsonNumber_IntegerPositiveOverflow_Test::TestBody(JsonNumber_IntegerPositiveOverflow_Test *this)

{
  bool bVar1;
  parser<callbacks_proxy<mock_json_callbacks>_> *this_00;
  error_code *lhs;
  char *message;
  error_code eVar2;
  AssertHelper local_120;
  Message local_118;
  error_code local_110;
  undefined1 local_100 [8];
  AssertionResult gtest_ar;
  allocator local_d9;
  string local_d8;
  mock_json_callbacks *local_b8;
  undefined1 local_b0 [8];
  parser<callbacks_proxy<mock_json_callbacks>_> p;
  JsonNumber_IntegerPositiveOverflow_Test *this_local;
  
  local_b8 = (this->super_JsonNumber).proxy_.original_;
  p.coordinate_ = (coord)this;
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::parser
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_b0,
             (callbacks_proxy<mock_json_callbacks>)local_b8,none);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"18446744073709551616",&local_d9);
  this_00 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::input
                      ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_b0,&local_d8);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::eof(this_00);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  lhs = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::last_error
                  ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_b0);
  eVar2 = pstore::json::make_error_code(number_out_of_range);
  local_110._M_cat = eVar2._M_cat;
  local_110._M_value = eVar2._M_value;
  testing::internal::EqHelper::Compare<std::error_code,_std::error_code,_nullptr>
            ((EqHelper *)local_100,"p.last_error ()",
             "make_error_code (json::error_code::number_out_of_range)",lhs,&local_110);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_number.cpp"
               ,0xe3,message);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::~parser
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_b0);
  return;
}

Assistant:

TEST_F (JsonNumber, IntegerPositiveOverflow) {
    json::parser<decltype (proxy_)> p (proxy_);
    p.input (std::string{uint64_overflow}).eof ();
    EXPECT_EQ (p.last_error (), make_error_code (json::error_code::number_out_of_range));
}